

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

size_t quantize_q4_1(float *src,void *dst,int64_t nrow,int64_t n_per_row,float *quant_weights)

{
  int64_t in_RDX;
  block_q4_1 *in_RSI;
  float *in_RDI;
  long in_R8;
  int64_t row;
  char *qrow;
  size_t row_size;
  float *in_stack_000000c8;
  int64_t in_stack_000000d0;
  block_q4_1 *in_stack_000000d8;
  float *in_stack_000000e0;
  int64_t in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 local_48;
  undefined8 local_8;
  
  if (in_R8 == 0) {
    quantize_row_q4_1_ref(in_RDI,in_RSI,in_RDX);
    local_8 = ggml_row_size((ggml_type)((ulong)in_RDX >> 0x20),in_stack_ffffffffffffffa8);
    local_8 = in_RDX * local_8;
  }
  else {
    local_8 = ggml_row_size((ggml_type)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                            in_stack_ffffffffffffffa8);
    for (local_48 = 0; local_48 < in_RDX; local_48 = local_48 + 1) {
      quantize_row_q4_1_impl
                (in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000c8);
    }
    local_8 = in_RDX * local_8;
  }
  return local_8;
}

Assistant:

size_t quantize_q4_1(const float * GGML_RESTRICT src, void * GGML_RESTRICT dst, int64_t nrow, int64_t n_per_row, const float * quant_weights) {
    if (!quant_weights) {
        quantize_row_q4_1_ref(src, dst, (int64_t)nrow*n_per_row);
        return nrow * ggml_row_size(GGML_TYPE_Q4_1, n_per_row);
    }
    size_t row_size = ggml_row_size(GGML_TYPE_Q4_1, n_per_row);
    char * qrow = (char *)dst;
    for (int64_t row = 0; row < nrow; ++row) {
        quantize_row_q4_1_impl(src, (block_q4_1*)qrow, n_per_row, quant_weights);
        src += n_per_row;
        qrow += row_size;
    }
    return nrow * row_size;
}